

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int16 * acmod_score(acmod_t *acmod,int *inout_frame_idx)

{
  int iVar1;
  int iVar2;
  int feat_idx;
  int frame_idx;
  int *inout_frame_idx_local;
  acmod_t *acmod_local;
  
  iVar1 = calc_frame_idx(acmod,inout_frame_idx);
  if (((acmod->compallsen == '\0') && (acmod->insenfh == (FILE *)0x0)) ||
     (iVar1 != acmod->senscr_frame)) {
    iVar2 = calc_feat_idx(acmod,iVar1);
    if (iVar2 < 0) {
      acmod_local = (acmod_t *)0x0;
    }
    else {
      if (acmod->insenfh == (FILE *)0x0) {
        acmod_flags2list(acmod);
        (*acmod->mgau->vt->frame_eval)
                  (acmod->mgau,acmod->senone_scores,acmod->senone_active,acmod->n_senone_active,
                   acmod->feat_buf[iVar2],iVar1,(int32)acmod->compallsen);
      }
      else {
        fseek((FILE *)acmod->insenfh,acmod->framepos[iVar2],0);
        iVar2 = acmod_read_scores_internal(acmod);
        if (iVar2 < 0) {
          return (int16 *)0x0;
        }
      }
      if (inout_frame_idx != (int *)0x0) {
        *inout_frame_idx = iVar1;
      }
      acmod->senscr_frame = iVar1;
      if ((acmod->senfh == (FILE *)0x0) ||
         (iVar1 = acmod_write_scores(acmod,acmod->n_senone_active,acmod->senone_active,
                                     acmod->senone_scores,acmod->senfh), -1 < iVar1)) {
        acmod_local = (acmod_t *)acmod->senone_scores;
      }
      else {
        acmod_local = (acmod_t *)0x0;
      }
    }
  }
  else {
    if (inout_frame_idx != (int *)0x0) {
      *inout_frame_idx = iVar1;
    }
    acmod_local = (acmod_t *)acmod->senone_scores;
  }
  return (int16 *)acmod_local;
}

Assistant:

int16 const *
acmod_score(acmod_t *acmod, int *inout_frame_idx)
{
    int frame_idx, feat_idx;

    /* Calculate the absolute frame index to be scored. */
    frame_idx = calc_frame_idx(acmod, inout_frame_idx);

    /* If all senones are being computed, or we are using a senone file,
       then we can reuse existing scores. */
    if ((acmod->compallsen || acmod->insenfh)
        && frame_idx == acmod->senscr_frame) {
        if (inout_frame_idx)
            *inout_frame_idx = frame_idx;
        return acmod->senone_scores;
    }

    /* Calculate position of requested frame in circular buffer. */
    if ((feat_idx = calc_feat_idx(acmod, frame_idx)) < 0)
        return NULL;

    /* If there is an input senone file locate the appropriate frame and read it. */
    if (acmod->insenfh) {
        fseek(acmod->insenfh, acmod->framepos[feat_idx], SEEK_SET);
        if (acmod_read_scores_internal(acmod) < 0)
            return NULL;
    }
    else {
        /* Build active senone list. */
        acmod_flags2list(acmod);

        /* Generate scores for the next available frame */
        ps_mgau_frame_eval(acmod->mgau,
                           acmod->senone_scores,
                           acmod->senone_active,
                           acmod->n_senone_active,
                           acmod->feat_buf[feat_idx],
                           frame_idx,
                           acmod->compallsen);
    }

    if (inout_frame_idx)
        *inout_frame_idx = frame_idx;
    acmod->senscr_frame = frame_idx;

    /* Dump scores to the senone dump file if one exists. */
    if (acmod->senfh) {
        if (acmod_write_scores(acmod, acmod->n_senone_active,
                               acmod->senone_active,
                               acmod->senone_scores,
                               acmod->senfh) < 0)
            return NULL;
        E_DEBUG("Frame %d has %d active states\n", frame_idx,
                acmod->n_senone_active);
    }

    return acmod->senone_scores;
}